

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

uint luai_makeseed(lua_State *L)

{
  uint uVar1;
  time_t tVar2;
  size_t t_2;
  size_t t_1;
  size_t t;
  int p;
  uint h;
  char buff [24];
  lua_State *L_local;
  
  buff._16_8_ = L;
  tVar2 = time((time_t *)0x0);
  t._4_4_ = (uint)tVar2;
  p._0_1_ = buff[0x10];
  p._1_1_ = buff[0x11];
  p._2_1_ = buff[0x12];
  p._3_1_ = buff[0x13];
  h._0_1_ = buff[0x14];
  h._1_1_ = buff[0x15];
  h._2_1_ = buff[0x16];
  h._3_1_ = buff[0x17];
  buff._0_8_ = (long)&t + 4;
  buff._8_8_ = lua_newstate;
  t._0_4_ = 0x18;
  uVar1 = luaS_hash((char *)&p,0x18,t._4_4_);
  return uVar1;
}

Assistant:

static unsigned int luai_makeseed (lua_State *L) {
  char buff[3 * sizeof(size_t)];
  unsigned int h = cast_uint(time(NULL));
  int p = 0;
  addbuff(buff, p, L);  /* heap variable */
  addbuff(buff, p, &h);  /* local variable */
  addbuff(buff, p, &lua_newstate);  /* public function */
  lua_assert(p == sizeof(buff));
  return luaS_hash(buff, p, h);
}